

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_button_image_styled(nk_context *ctx,nk_style_button *style,nk_image img)

{
  nk_window *pnVar1;
  nk_panel *pnVar2;
  nk_widget_layout_states nVar3;
  nk_context *local_60;
  undefined1 auStack_48 [4];
  nk_widget_layout_states state;
  nk_rect bounds;
  nk_input *in;
  nk_panel *layout;
  nk_window *win;
  nk_style_button *style_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4ab6,
                  "int nk_button_image_styled(struct nk_context *, const struct nk_style_button *, struct nk_image)"
                 );
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4ab7,
                  "int nk_button_image_styled(struct nk_context *, const struct nk_style_button *, struct nk_image)"
                 );
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4ab8,
                  "int nk_button_image_styled(struct nk_context *, const struct nk_style_button *, struct nk_image)"
                 );
  }
  if (((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) ||
     (ctx->current->layout == (nk_panel *)0x0)) {
    ctx_local._4_4_ = 0;
  }
  else {
    pnVar1 = ctx->current;
    pnVar2 = pnVar1->layout;
    nVar3 = nk_widget((nk_rect *)auStack_48,ctx);
    if (nVar3 == NK_WIDGET_INVALID) {
      ctx_local._4_4_ = 0;
    }
    else {
      if ((nVar3 == NK_WIDGET_ROM) || (local_60 = ctx, (pnVar2->flags & 0x800) != 0)) {
        local_60 = (nk_context *)0x0;
      }
      bounds._8_8_ = local_60;
      ctx_local._4_4_ =
           nk_do_button_image(&ctx->last_widget_state,&pnVar1->buffer,_auStack_48,img,
                              ctx->button_behavior,style,&local_60->input);
    }
  }
  return ctx_local._4_4_;
}

Assistant:

NK_API int
nk_button_image_styled(struct nk_context *ctx, const struct nk_style_button *style,
    struct nk_image img)
{
    struct nk_window *win;
    struct nk_panel *layout;
    const struct nk_input *in;

    struct nk_rect bounds;
    enum nk_widget_layout_states state;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    layout = win->layout;

    state = nk_widget(&bounds, ctx);
    if (!state) return 0;
    in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    return nk_do_button_image(&ctx->last_widget_state, &win->buffer, bounds,
                img, ctx->button_behavior, style, in);
}